

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceVisitor.hpp
# Opt level: O0

void __thiscall
netlist::InstanceVisitor::handleInstanceExtPorts(InstanceVisitor *this,InstanceSymbol *symbol)

{
  ArgumentDirection AVar1;
  LookupLocation lookupLocation;
  bool bVar2;
  reference ppPVar3;
  PortSymbol *pPVar4;
  RootSymbol *pRVar5;
  reference ppNVar6;
  NetlistNode *node;
  iterator __end4;
  iterator __begin4;
  vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_> *__range4;
  VariableReferenceVisitor visitor;
  bool isLeftOperand;
  EvalContext evalCtx;
  ArgumentDirection direction;
  PortSymbol *port;
  PortConnection *portConnection;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *__range2;
  undefined7 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5f;
  EvalContext *in_stack_fffffffffffffb60;
  ASTContext *in_stack_fffffffffffffb68;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffb70;
  NetlistNode *node_00;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  NetlistNode *in_stack_fffffffffffffb90;
  iterator in_stack_fffffffffffffb98;
  iterator in_stack_fffffffffffffba0;
  VariableReferenceVisitor local_450;
  undefined4 local_408;
  undefined1 local_3f2;
  bitmask<slang::ast::EvalFlags> local_3f1;
  bitmask<slang::ast::ASTFlags> local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  PortConnection *in_stack_fffffffffffffd18;
  __normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
  local_30;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> local_28;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *local_18;
  
  local_28 = slang::ast::InstanceSymbol::getPortConnections
                       ((InstanceSymbol *)
                        CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
  local_18 = &local_28;
  local_30._M_current =
       (PortConnection **)
       std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *)
                  CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
  std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffb68);
  while (bVar2 = __gnu_cxx::
                 operator==<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffb60,
                            (__normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
                             *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    ppPVar3 = __gnu_cxx::
              __normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
              ::operator*(&local_30);
    if ((*ppPVar3)->port->kind == Port) {
      slang::ast::Symbol::as<slang::ast::PortSymbol>((Symbol *)0x192717);
      pPVar4 = slang::ast::Symbol::as<slang::ast::PortSymbol>((Symbol *)0x19272f);
      AVar1 = pPVar4->direction;
      pRVar5 = slang::ast::Compilation::getRoot((Compilation *)0x192749);
      node_00 = (NetlistNode *)&pRVar5->super_Scope;
      local_3e8 = slang::ast::LookupLocation::max;
      local_3e0 = DAT_00de66d0;
      slang::bitmask<slang::ast::ASTFlags>::bitmask(&local_3f0,None);
      lookupLocation._8_7_ = in_stack_fffffffffffffb80;
      lookupLocation.scope = (Scope *)node_00;
      lookupLocation._15_1_ = in_stack_fffffffffffffb87;
      slang::ast::ASTContext::ASTContext
                (in_stack_fffffffffffffb68,(Scope *)in_stack_fffffffffffffb60,lookupLocation,
                 in_stack_fffffffffffffb70);
      memset(&local_3f1,0,1);
      slang::bitmask<slang::ast::EvalFlags>::bitmask(&local_3f1);
      slang::ast::EvalContext::EvalContext
                ((EvalContext *)in_stack_fffffffffffffb98._M_current,
                 (ASTContext *)in_stack_fffffffffffffb90,
                 (bitmask<slang::ast::EvalFlags>)
                 (underlying_type)((ulong)in_stack_fffffffffffffba0._M_current >> 0x38));
      in_stack_fffffffffffffb87 = AVar1 == In || AVar1 == InOut;
      local_3f2 = in_stack_fffffffffffffb87;
      in_stack_fffffffffffffb70.m_bits =
           (underlying_type)slang::ast::PortConnection::getExpression(in_stack_fffffffffffffd18);
      if ((VariableReferenceVisitor *)in_stack_fffffffffffffb70.m_bits ==
          (VariableReferenceVisitor *)0x0) {
        local_408 = 3;
      }
      else {
        VariableReferenceVisitor::VariableReferenceVisitor
                  ((VariableReferenceVisitor *)in_stack_fffffffffffffb70.m_bits,
                   (Netlist *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                   (bool)in_stack_fffffffffffffb5f);
        in_stack_fffffffffffffb68 =
             (ASTContext *)slang::ast::PortConnection::getExpression(in_stack_fffffffffffffd18);
        slang::ast::Expression::visit<netlist::VariableReferenceVisitor&>
                  ((Expression *)in_stack_fffffffffffffb60,
                   (VariableReferenceVisitor *)
                   CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
        in_stack_fffffffffffffb60 = (EvalContext *)VariableReferenceVisitor::getVars(&local_450);
        in_stack_fffffffffffffba0 =
             std::vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>::begin
                       ((vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_> *)
                        CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
        in_stack_fffffffffffffb98 =
             std::vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>::end
                       ((vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_> *)
                        CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58));
        while (bVar2 = __gnu_cxx::
                       operator==<netlist::NetlistNode_**,_std::vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>_>
                                 ((__normal_iterator<netlist::NetlistNode_**,_std::vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>_>
                                   *)in_stack_fffffffffffffb60,
                                  (__normal_iterator<netlist::NetlistNode_**,_std::vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58)),
              ((bVar2 ^ 0xffU) & 1) != 0) {
          ppNVar6 = __gnu_cxx::
                    __normal_iterator<netlist::NetlistNode_**,_std::vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>_>
                    ::operator*((__normal_iterator<netlist::NetlistNode_**,_std::vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>_>
                                 *)&stack0xfffffffffffffba0);
          in_stack_fffffffffffffb90 = *ppNVar6;
          connectPortExternal((InstanceVisitor *)
                              CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),node_00,
                              (Symbol *)in_stack_fffffffffffffb70.m_bits,
                              (ArgumentDirection)((ulong)in_stack_fffffffffffffb68 >> 0x20));
          __gnu_cxx::
          __normal_iterator<netlist::NetlistNode_**,_std::vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>_>
          ::operator++((__normal_iterator<netlist::NetlistNode_**,_std::vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>_>
                        *)&stack0xfffffffffffffba0);
        }
        VariableReferenceVisitor::~VariableReferenceVisitor
                  ((VariableReferenceVisitor *)in_stack_fffffffffffffb60);
        local_408 = 0;
      }
      slang::ast::EvalContext::~EvalContext(in_stack_fffffffffffffb60);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

auto handleInstanceExtPorts(ast::InstanceSymbol const& symbol) {

        for (auto* portConnection : symbol.getPortConnections()) {

            if (portConnection->port.kind == ast::SymbolKind::Port) {
                auto& port = portConnection->port.as<ast::PortSymbol>();
                auto direction = portConnection->port.as<ast::PortSymbol>().direction;

                ast::EvalContext evalCtx(
                    ast::ASTContext(compilation.getRoot(), ast::LookupLocation::max));

                // The port is the target of an assignment if it is an input.
                bool isLeftOperand = direction == ast::ArgumentDirection::In ||
                                     direction == ast::ArgumentDirection::InOut;

                if (portConnection->getExpression() == nullptr) {
                    // Empty port hookup so skip.
                    continue;
                }

                // Collect variable references in the port expression.
                VariableReferenceVisitor visitor(netlist, evalCtx, isLeftOperand);
                portConnection->getExpression()->visit(visitor);

                for (auto* node : visitor.getVars()) {
                    connectPortExternal(node, portConnection->port, direction);
                }
            }
            else if (portConnection->port.kind == ast::SymbolKind::InterfacePort) {
                // Skip
            }
            else {
                SLANG_UNREACHABLE;
            }
        }
    }